

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,7ul,date::characters_t<char,3ul>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_7UL> *fmt,characters_t<char,_3UL> *others)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_00;
  pair<date::static_string<char,_4UL>,_unsigned_char> *ppVar4;
  long lVar5;
  long lVar6;
  byte unaff_R12B;
  size_t i;
  ulong uVar7;
  bool bVar8;
  array<bool,_7UL> is_match;
  array<const_char_*,_7UL> str_list;
  char acStack_8f [7];
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *local_88;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *local_80;
  aliases_t<char,_4UL,_unsigned_char,_7UL> *local_78;
  characters_t<char,_3UL> *local_70;
  long alStack_68 [7];
  
  ppVar4 = fmt->aliases->_M_elems;
  lVar5 = 0;
  do {
    alStack_68[lVar5] = (long)ppVar4;
    acStack_8f[lVar5] =
         (((pair<date::static_string<char,_4UL>,_unsigned_char> *)&ppVar4->first)->first).m_length
         != 0;
    lVar5 = lVar5 + 1;
    ppVar4 = ppVar4 + 1;
  } while (lVar5 != 7);
  lVar5 = 0;
  local_88 = pos;
  local_80 = end;
  local_78 = fmt;
  local_70 = others;
  do {
    if (local_80->m_position == pos->m_position) break;
    cVar1 = pos->m_cache[pos->m_position];
    lVar6 = 2;
    bVar8 = false;
    uVar7 = 0;
    do {
      pos_00 = local_88;
      if (acStack_8f[uVar7] == '\x01') {
        pcVar2 = (char *)alStack_68[uVar7];
        if (*pcVar2 == cVar1) {
          if (pcVar2[1] != '\0') {
            alStack_68[uVar7] = (long)(pcVar2 + 1);
            goto LAB_00107cce;
          }
          iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                    (local_88);
          *local_78->value = (&local_78->aliases->_M_elems[0].first.m_data)[lVar6 * 2]._M_elems[0];
          unaff_R12B = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
                                 (pos_00,local_80,local_70);
          bVar3 = false;
        }
        else {
          acStack_8f[uVar7] = '\0';
LAB_00107cce:
          bVar3 = true;
        }
        if (!bVar3) break;
      }
      bVar8 = 5 < uVar7;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 3;
    } while (uVar7 != 7);
    pos = local_88;
    if (!bVar8) goto LAB_00107d49;
    lVar5 = lVar5 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(local_88);
  } while (lVar5 != 4);
  unaff_R12B = 0;
LAB_00107d49:
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}